

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::TextFormat::OutOfLinePrintString<absl::lts_20250127::Hex>
               (BaseTextGenerator *generator,Hex *values)

{
  AlphaNum *a;
  string local_98;
  AlphaNum local_78;
  string local_48;
  string_view local_28;
  Hex *local_18;
  Hex *values_local;
  BaseTextGenerator *generator_local;
  
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = 0;
  local_98._M_dataplus = (_Alloc_hider)0x0;
  local_98._1_7_ = 0;
  local_98._M_string_length = 0;
  local_18 = values;
  values_local = (Hex *)generator;
  absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_98);
  absl::lts_20250127::AlphaNum::AlphaNum<absl::lts_20250127::Hex,void>
            (&local_78,values,(StringifySink *)&local_98);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_48,(lts_20250127 *)&local_78,a);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  BaseTextGenerator::PrintString(generator,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_98);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}